

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall
QGraphicsViewPrivate::populateSceneDragDropEvent
          (QGraphicsViewPrivate *this,QGraphicsSceneDragDropEvent *dest,QDropEvent *source)

{
  QWidget *pQVar1;
  QWidget *source_00;
  long in_FS_OFFSET;
  QPointF QVar2;
  QPointF local_68;
  QPoint local_50;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  local_68.xp = *(qreal *)(source + 0x10);
  local_68.yp = *(qreal *)(source + 0x18);
  local_50 = QPointF::toPoint(&local_68);
  QVar2 = QGraphicsView::mapToScene((QGraphicsView *)pQVar1,&local_50);
  local_48.yp = QVar2.yp;
  local_48.xp = QVar2.xp;
  QGraphicsSceneDragDropEvent::setScenePos(dest,&local_48);
  local_48.xp = *(qreal *)(source + 0x10);
  local_48.yp = *(qreal *)(source + 0x18);
  local_50 = QPointF::toPoint(&local_48);
  local_68.xp = (qreal)QWidget::mapToGlobal(pQVar1,&local_50);
  QGraphicsSceneDragDropEvent::setScreenPos(dest,(QPoint *)&local_68);
  QGraphicsSceneDragDropEvent::setButtons
            (dest,(QFlagsStorageHelper<Qt::MouseButton,_4>)
                  *(QFlagsStorage<Qt::MouseButton> *)(source + 0x20));
  QGraphicsSceneDragDropEvent::setModifiers
            (dest,(QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                  *(QFlagsStorage<Qt::KeyboardModifier> *)(source + 0x24));
  QGraphicsSceneDragDropEvent::setPossibleActions
            (dest,(QFlagsStorageHelper<Qt::DropAction,_4>)
                  *(QFlagsStorage<Qt::DropAction> *)(source + 0x28));
  QGraphicsSceneDragDropEvent::setProposedAction(dest,*(DropAction *)(source + 0x30));
  QGraphicsSceneDragDropEvent::setDropAction(dest,*(DropAction *)(source + 0x2c));
  QGraphicsSceneDragDropEvent::setMimeData(dest,*(QMimeData **)(source + 0x38));
  QGraphicsSceneEvent::setWidget
            (&dest->super_QGraphicsSceneEvent,(this->super_QAbstractScrollAreaPrivate).viewport);
  pQVar1 = (QWidget *)QDropEvent::source();
  if (pQVar1 == (QWidget *)0x0) {
    source_00 = (QWidget *)0x0;
  }
  else {
    source_00 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar1->field_0x8 + 0x30) & 1) != 0) {
      source_00 = pQVar1;
    }
  }
  QGraphicsSceneDragDropEvent::setSource(dest,source_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsViewPrivate::populateSceneDragDropEvent(QGraphicsSceneDragDropEvent *dest,
                                                      QDropEvent *source)
{
#if QT_CONFIG(draganddrop)
    Q_Q(QGraphicsView);
    dest->setScenePos(q->mapToScene(source->position().toPoint()));
    dest->setScreenPos(q->mapToGlobal(source->position().toPoint()));
    dest->setButtons(source->buttons());
    dest->setModifiers(source->modifiers());
    dest->setPossibleActions(source->possibleActions());
    dest->setProposedAction(source->proposedAction());
    dest->setDropAction(source->dropAction());
    dest->setMimeData(source->mimeData());
    dest->setWidget(viewport);
    dest->setSource(qobject_cast<QWidget *>(source->source()));
#else
    Q_UNUSED(dest);
    Q_UNUSED(source);
#endif
}